

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

void evutil_getaddrinfo_infer_protocols(addrinfo *hints)

{
  int iVar1;
  
  if (hints->ai_protocol == 0) {
    if (hints->ai_socktype == 2) {
      iVar1 = 0x11;
    }
    else {
      if (hints->ai_socktype != 1) goto LAB_001f33ac;
      iVar1 = 6;
    }
    hints->ai_protocol = iVar1;
  }
LAB_001f33ac:
  if (hints->ai_socktype != 0) {
    return;
  }
  iVar1 = hints->ai_protocol;
  if (iVar1 != 0x84) {
    if (iVar1 == 0x11) {
      iVar1 = 2;
      goto LAB_001f33d3;
    }
    if (iVar1 != 6) {
      return;
    }
  }
  iVar1 = 1;
LAB_001f33d3:
  hints->ai_socktype = iVar1;
  return;
}

Assistant:

static void
evutil_getaddrinfo_infer_protocols(struct evutil_addrinfo *hints)
{
	/* If we can guess the protocol from the socktype, do so. */
	if (!hints->ai_protocol && hints->ai_socktype) {
		if (hints->ai_socktype == SOCK_DGRAM)
			hints->ai_protocol = IPPROTO_UDP;
		else if (hints->ai_socktype == SOCK_STREAM)
			hints->ai_protocol = IPPROTO_TCP;
	}

	/* Set the socktype if it isn't set. */
	if (!hints->ai_socktype && hints->ai_protocol) {
		if (hints->ai_protocol == IPPROTO_UDP)
			hints->ai_socktype = SOCK_DGRAM;
		else if (hints->ai_protocol == IPPROTO_TCP)
			hints->ai_socktype = SOCK_STREAM;
#ifdef IPPROTO_SCTP
		else if (hints->ai_protocol == IPPROTO_SCTP)
			hints->ai_socktype = SOCK_STREAM;
#endif
	}
}